

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

command_node * __thiscall
libchars::command_node::add_root(command_node *this,filter_t mask_,bool hidden_)

{
  command_node *this_00;
  
  if (this->start == (command_node *)0x0) {
    this_00 = (command_node *)operator_new(0x58,(nothrow_t *)&std::nothrow);
    if (this_00 == (command_node *)0x0) {
      this_00 = (command_node *)0x0;
    }
    else {
      command_node(this_00);
    }
    this->start = this_00;
    if (this_00 != (command_node *)0x0) {
      this_00->mask = mask_;
      this_00->hidden = hidden_;
    }
  }
  return this->start;
}

Assistant:

command_node *command_node::add_root(command::filter_t mask_, bool hidden_)
    {
        if (start == NULL) {
            start = new (std::nothrow) command_node();
            if (start != NULL) {
                start->mask = mask_;
                start->hidden = hidden_;
            }
        }
        return start;
    }